

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vanilla_index.cpp
# Opt level: O0

pair<std::shared_ptr<cornelich::region>,_long> * __thiscall
cornelich::vanilla_index::append
          (pair<std::shared_ptr<cornelich::region>,_long> *__return_storage_ptr__,
          vanilla_index *this,int32_t cycle,int64_t index_value,int32_t file_number)

{
  bool bVar1;
  element_type *region_00;
  logic_error *this_00;
  streamer *psVar2;
  cycle_formatter *cycle_00;
  undefined1 local_228 [424];
  undefined1 local_80 [48];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_50;
  int64_t position;
  undefined1 local_40 [8];
  region_ptr region;
  int index_count;
  int32_t file_number_local;
  int64_t index_value_local;
  header_holder<boost::multi_index::detail::sequenced_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::index_node_base<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>,_std::allocator<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>_>_>_>_>_*,_boost::multi_index::multi_index_container<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>,_boost::multi_index::indexed_by<boost::multi_index::sequenced<boost::multi_index::tag<cornelich::util::cache<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>,_cornelich::region_ptr_validator>::tag_sequence,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>_>,_boost::multi_index::hashed_unique<boost::multi_index::tag<cornelich::util::cache<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>,_cornelich::region_ptr_validator>::tag_key,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::multi_index::member<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>,_std::tuple<int,_int>,_&std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>>::first>,_mpl_::na,_mpl_::na>,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_std::allocator<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>_>_>_>
  hStack_18;
  int32_t cycle_local;
  vanilla_index *this_local;
  
  region.super___shared_ptr<cornelich::region,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ =
       file_number;
  region.super___shared_ptr<cornelich::region,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ =
       file_number;
  _index_count = (element_type *)index_value;
  index_value_local._4_4_ = cycle;
  hStack_18.member =
       (sequenced_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::index_node_base<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>,_std::allocator<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>_>_>_>_>
        *)this;
  this_local = (vanilla_index *)__return_storage_ptr__;
  while( true ) {
    if (9999 < (int32_t)region.super___shared_ptr<cornelich::region,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi) {
      this_00 = (logic_error *)__cxa_allocate_exception(0x10);
      util::streamer::streamer((streamer *)(local_228 + 0x20));
      psVar2 = util::streamer::operator<<
                         ((streamer *)(local_228 + 0x20),(char (*) [22])"Unable to write index");
      psVar2 = util::streamer::operator<<(psVar2,(long *)&index_count);
      psVar2 = util::streamer::operator<<(psVar2,(char (*) [10])"on cycle ");
      psVar2 = util::streamer::operator<<(psVar2,(int *)((long)&index_value_local + 4));
      psVar2 = util::streamer::operator<<(psVar2,(char (*) [2])"(");
      cycle_00 = vanilla_chronicle_settings::cycle_format(this->m_settings);
      cycle_formatter::date_from_cycle_abi_cxx11_((cycle_formatter *)local_228,(int64_t)cycle_00);
      psVar2 = util::streamer::operator<<
                         (psVar2,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_228);
      util::streamer::operator<<(psVar2,(char (*) [2])0x1994fa);
      util::streamer::str_abi_cxx11_((streamer *)local_80);
      std::logic_error::logic_error(this_00,(string *)local_80);
      __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
    }
    index_for((vanilla_index *)local_40,(int32_t)this,index_value_local._4_4_,
              SUB41((int32_t)region.
                             super___shared_ptr<cornelich::region,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi,0));
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_40);
    if (bVar1) {
      region_00 = std::
                  __shared_ptr_access<cornelich::region,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator*((__shared_ptr_access<cornelich::region,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_40);
      local_50._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)append(region_00,(int64_t)_index_count);
      if ((long)local_50._M_pi < 0) {
        position._4_4_ = 0;
      }
      else {
        std::pair<std::shared_ptr<cornelich::region>,_long>::
        pair<std::shared_ptr<cornelich::region>_&,_long_&,_true>
                  (__return_storage_ptr__,(shared_ptr<cornelich::region> *)local_40,
                   (long *)&local_50);
        position._4_4_ = 1;
      }
    }
    else {
      position._4_4_ = 4;
    }
    std::shared_ptr<cornelich::region>::~shared_ptr((shared_ptr<cornelich::region> *)local_40);
    if ((position._4_4_ != 0) && (position._4_4_ == 1)) break;
    region.super___shared_ptr<cornelich::region,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_
         = (int32_t)region.super___shared_ptr<cornelich::region,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi + 1;
  }
  return __return_storage_ptr__;
}

Assistant:

std::pair<region_ptr, std::int64_t> vanilla_index::append(std::int32_t cycle, std::int64_t index_value, std::int32_t file_number)
{
    for (int index_count = file_number; index_count < 10000; ++index_count)
    {
        auto region = index_for(cycle, index_count, true);
        if(!region)
            continue;
        auto position = append(*region, index_value);
        if (position >= 0) {
            return {region, position};
        }
    }

    throw std::logic_error((util::streamer()
                            << "Unable to write index" << index_value
                            << "on cycle " << cycle
                            << "(" <<  m_settings.cycle_format().date_from_cycle(cycle) << ")").str());
}